

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getReducedRow
          (Highs *this,HighsInt row,double *row_vector,HighsInt *row_num_nz,HighsInt *row_indices,
          double *pass_basis_inverse_row_vector)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  HighsStatus HVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  vector<double,_std::allocator<double>_> basis_inverse_row;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> local_98;
  HighsInt *local_78;
  value_type_conflict1 local_70;
  vector<double,_std::allocator<double>_> local_68;
  string local_50;
  
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if (row_vector == (double *)0x0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getReducedRow: row_vector is NULL\n");
  }
  else {
    uVar1 = (this->model_).lp_.num_row_;
    local_78 = row_indices;
    if (-1 < row && row < (int)uVar1) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (double *)0x0;
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        if (pass_basis_inverse_row_vector == (double *)0x0) {
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_70 = 0.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_68,(ulong)uVar1,&local_70);
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)row] = 1.0;
          local_70 = 0.0;
          std::vector<double,_std::allocator<double>_>::resize(&local_98,(ulong)uVar1,&local_70);
          basisSolveInterface(this,&local_68,
                              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,(HighsInt *)0x0,(HighsInt *)0x0,true)
          ;
          pass_basis_inverse_row_vector =
               local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if (row_num_nz != (HighsInt *)0x0) {
          *row_num_nz = 0;
        }
        iVar9 = (this->model_).lp_.num_col_;
        if (0 < iVar9) {
          piVar4 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar5 = (this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (this->model_).lp_.a_matrix_.value_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            iVar2 = piVar4[lVar8];
            lVar10 = (long)iVar2;
            iVar3 = piVar4[lVar8 + 1];
            dVar11 = 0.0;
            if (iVar2 < iVar3) {
              do {
                dVar11 = dVar11 + pdVar6[lVar10] * pass_basis_inverse_row_vector[piVar5[lVar10]];
                lVar10 = lVar10 + 1;
              } while (iVar3 != lVar10);
            }
            row_vector[lVar8] = 0.0;
            if (1e-14 < ABS(dVar11)) {
              if (row_num_nz != (HighsInt *)0x0) {
                iVar9 = *row_num_nz;
                *row_num_nz = iVar9 + 1;
                local_78[iVar9] = (HighsInt)lVar8;
                iVar9 = (this->model_).lp_.num_col_;
              }
              row_vector[lVar8] = dVar11;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < iVar9);
        }
        if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return kOk;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"getReducedRow","");
      HVar7 = invertRequirementError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return HVar7;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return HVar7;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Row index %d out of range [0, %d] in getReducedRow\n",(ulong)(uint)row,
                 (ulong)(uVar1 - 1));
  }
  return kError;
}

Assistant:

HighsStatus Highs::getReducedRow(const HighsInt row, double* row_vector,
                                 HighsInt* row_num_nz, HighsInt* row_indices,
                                 const double* pass_basis_inverse_row_vector) {
  HighsLp& lp = model_.lp_;
  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (row_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getReducedRow: row_vector is NULL\n");
    return HighsStatus::kError;
  }
  // row_indices can be NULL - it's the trigger that determines
  // whether they are identified or not pass_basis_inverse_row_vector
  // NULL - it's the trigger to determine whether it's computed or not
  if (row < 0 || row >= lp.num_row_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT "] in getReducedRow\n",
                 row, lp.num_row_ - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getReducedRow");
  HighsInt num_row = lp.num_row_;
  vector<double> basis_inverse_row;
  double* basis_inverse_row_vector = (double*)pass_basis_inverse_row_vector;
  if (basis_inverse_row_vector == NULL) {
    vector<double> rhs;
    vector<HighsInt> col_indices;
    rhs.assign(num_row, 0);
    rhs[row] = 1;
    basis_inverse_row.resize(num_row, 0);
    // Form B^{-T}e_{row}
    basisSolveInterface(rhs, basis_inverse_row.data(), NULL, NULL, true);
    basis_inverse_row_vector = basis_inverse_row.data();
  }
  bool return_indices = row_num_nz != NULL;
  if (return_indices) *row_num_nz = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = 0;
    for (HighsInt el = lp.a_matrix_.start_[col];
         el < lp.a_matrix_.start_[col + 1]; el++) {
      HighsInt row = lp.a_matrix_.index_[el];
      value += lp.a_matrix_.value_[el] * basis_inverse_row_vector[row];
    }
    row_vector[col] = 0;
    if (fabs(value) > kHighsTiny) {
      if (return_indices) row_indices[(*row_num_nz)++] = col;
      row_vector[col] = value;
    }
  }
  return HighsStatus::kOk;
}